

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::setDefaultPrecision
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TPrecisionQualifier qualifier
          )

{
  char cVar1;
  TBasicType t;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar6;
  
  t = publicType->basicType;
  uVar6 = (ulong)t;
  if (uVar6 == 0xe) {
    uVar3 = computeSamplerTypeIndex(this,&publicType->sampler);
    this->defaultSamplerPrecision[uVar3] = qualifier;
    return;
  }
  if (uVar6 == 1) {
LAB_0041a200:
    bVar2 = TPublicType::isScalar(publicType);
    if (bVar2) {
      this->defaultPrecision[uVar6] = qualifier;
      if (uVar6 == 8) {
        this->defaultPrecision[9] = qualifier;
        (this->precisionManager).explicitIntDefault = true;
        cVar1 = (this->precisionManager).explicitFloatDefault;
      }
      else {
        (this->precisionManager).explicitFloatDefault = true;
        cVar1 = (this->precisionManager).explicitIntDefault;
      }
      if (cVar1 == '\x01') {
        (this->precisionManager).warn = false;
      }
      return;
    }
  }
  else {
    if (t == EbtAtomicUint) {
      if (qualifier == EpqHigh) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar5 = "can only apply highp to atomic_uint";
      pcVar4 = "precision";
      goto LAB_0041a25f;
    }
    if (t == EbtInt) goto LAB_0041a200;
  }
  pcVar4 = TType::getBasicString(t);
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar5 = "cannot apply precision statement to this type; use \'float\', \'int\' or a sampler type"
  ;
LAB_0041a25f:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,pcVar4,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::setDefaultPrecision(const TSourceLoc& loc, TPublicType& publicType, TPrecisionQualifier qualifier)
{
    TBasicType basicType = publicType.basicType;

    if (basicType == EbtSampler) {
        defaultSamplerPrecision[computeSamplerTypeIndex(publicType.sampler)] = qualifier;

        return;  // all is well
    }

    if (basicType == EbtInt || basicType == EbtFloat) {
        if (publicType.isScalar()) {
            defaultPrecision[basicType] = qualifier;
            if (basicType == EbtInt) {
                defaultPrecision[EbtUint] = qualifier;
                precisionManager.explicitIntDefaultSeen();
            } else
                precisionManager.explicitFloatDefaultSeen();

            return;  // all is well
        }
    }

    if (basicType == EbtAtomicUint) {
        if (qualifier != EpqHigh)
            error(loc, "can only apply highp to atomic_uint", "precision", "");

        return;
    }

    error(loc, "cannot apply precision statement to this type; use 'float', 'int' or a sampler type", TType::getBasicString(basicType), "");
}